

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void DrawTextureNPatch(Texture2D texture,NPatchInfo nPatchInfo,Rectangle dest,Vector2 origin,
                      float rotation,Color tint)

{
  float fVar1;
  NPatchInfo NVar2;
  undefined4 in_EDX;
  uint uVar3;
  float x;
  float y;
  float y_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float x_00;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float x_01;
  float y_01;
  float x_02;
  float x_03;
  float fVar14;
  float fVar15;
  float local_e8;
  float local_d8;
  float fStack_d4;
  float local_68;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  NVar2 = nPatchInfo;
  auVar4._0_8_ = dest._8_8_;
  auVar4._8_8_ = dest._8_8_;
  if (texture.id == 0) {
    return;
  }
  auVar11._0_4_ = -(uint)(0 < (int)dest.width);
  auVar11._4_4_ = -(uint)(0 < (int)dest.height);
  auVar11._8_4_ = -(uint)(0 < (int)dest.width);
  auVar11._12_4_ = -(uint)(0 < (int)dest.height);
  auVar11 = auVar11 & auVar4;
  if (nPatchInfo.source.width < 0.0) {
    nPatchInfo.source.x = nPatchInfo.source.x - nPatchInfo.source.width;
  }
  auVar5._0_4_ = -(uint)(nPatchInfo.layout == 1);
  auVar5._4_4_ = -(uint)(nPatchInfo.layout == 2);
  auVar5._8_4_ = 0xffffffff;
  auVar5._12_4_ = 0xffffffff;
  auVar13._0_4_ = (uint)nPatchInfo.source.width & auVar5._0_4_;
  auVar13._4_4_ = (uint)nPatchInfo.source.height & auVar5._4_4_;
  auVar13._8_8_ = 0;
  auVar13 = auVar13 | ~auVar5 & auVar11;
  x_01 = (float)NVar2.left;
  y_01 = (float)NVar2.top;
  fVar14 = (float)NVar2.right;
  local_68 = (float)NVar2.bottom;
  fVar12 = auVar13._0_4_;
  fVar9 = auVar13._4_4_;
  auVar10._4_4_ = -(uint)(y_01 + local_68 < fVar9);
  auVar10._0_4_ = -(uint)(x_01 + fVar14 < fVar12);
  auVar10._8_4_ = -(uint)(0.0 < auVar13._8_4_);
  auVar10._12_4_ = -(uint)(0.0 < auVar13._12_4_);
  auVar10 = auVar10 | auVar5;
  auVar6._0_8_ = auVar10._0_8_;
  auVar6._8_4_ = auVar10._4_4_;
  auVar6._12_4_ = auVar10._12_4_;
  auVar7._0_8_ = auVar6._0_8_ << 0x3f;
  auVar7._8_8_ = auVar6._8_8_ << 0x3f;
  uVar3 = movmskpd(in_EDX,auVar7);
  x_03 = x_01;
  if ((uVar3 & 1) == 0) {
    x_03 = (x_01 / (x_01 + fVar14)) * fVar12;
    fVar14 = fVar12 - x_03;
  }
  fVar8 = (float)texture.width;
  fVar15 = (float)texture.height;
  fVar1 = (float)(~-(uint)(nPatchInfo.source.height < 0.0) & (uint)nPatchInfo.source.y |
                 (uint)(nPatchInfo.source.y - nPatchInfo.source.height) &
                 -(uint)(nPatchInfo.source.height < 0.0));
  local_e8 = y_01;
  if ((byte)((byte)uVar3 >> 1) == 0) {
    local_e8 = (y_01 / (y_01 + local_68)) * fVar9;
    local_68 = fVar9 - local_e8;
  }
  fVar12 = fVar12 - fVar14;
  x = nPatchInfo.source.x / fVar8;
  y = fVar1 / fVar15;
  x_02 = (nPatchInfo.source.x + x_03) / fVar8;
  x_00 = ((nPatchInfo.source.width + nPatchInfo.source.x) - fVar14) / fVar8;
  fVar8 = (nPatchInfo.source.width + nPatchInfo.source.x) / fVar8;
  fVar14 = (nPatchInfo.source.height + fVar1) / fVar15;
  rlSetTexture(texture.id);
  rlPushMatrix();
  local_58 = dest.x;
  fStack_54 = dest.y;
  rlTranslatef(local_58,fStack_54,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  local_48 = origin.x;
  fStack_44 = origin.y;
  rlTranslatef(-local_48,-fStack_44,0.0);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  rlNormal3f(0.0,0.0,1.0);
  local_d8 = auVar11._0_4_;
  if (nPatchInfo.layout == 2) {
    rlTexCoord2f(x,fVar14);
    rlVertex2f(0.0,nPatchInfo.source.height);
    rlTexCoord2f(x_02,fVar14);
    rlVertex2f(x_03,nPatchInfo.source.height);
    rlTexCoord2f(x_02,y);
    rlVertex2f(x_03,0.0);
    rlTexCoord2f(x,y);
    rlVertex2f(0.0,0.0);
    if ((uVar3 & 1) != 0) {
      rlTexCoord2f(x_02,fVar14);
      rlVertex2f(x_01,nPatchInfo.source.height);
      rlTexCoord2f(x_00,fVar14);
      rlVertex2f(fVar12,nPatchInfo.source.height);
      rlTexCoord2f(x_00,y);
      rlVertex2f(fVar12,0.0);
      rlTexCoord2f(x_02,y);
      rlVertex2f(x_01,0.0);
    }
    rlTexCoord2f(x_00,fVar14);
    rlVertex2f(fVar12,nPatchInfo.source.height);
    rlTexCoord2f(fVar8,fVar14);
    rlVertex2f(local_d8,nPatchInfo.source.height);
    rlTexCoord2f(fVar8,y);
    rlVertex2f(local_d8,0.0);
    rlTexCoord2f(x_00,y);
    fVar9 = 0.0;
  }
  else {
    fVar9 = fVar9 - local_68;
    y_00 = (fVar1 + local_e8) / fVar15;
    fVar15 = ((nPatchInfo.source.height + fVar1) - local_68) / fVar15;
    fStack_d4 = auVar11._4_4_;
    if (nPatchInfo.layout == 1) {
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,local_e8);
      rlTexCoord2f(fVar8,y_00);
      rlVertex2f(nPatchInfo.source.width,local_e8);
      rlTexCoord2f(fVar8,y);
      rlVertex2f(nPatchInfo.source.width,0.0);
      rlTexCoord2f(x,y);
      rlVertex2f(0.0,0.0);
      if ((uVar3 & 1) != 0) {
        rlTexCoord2f(x,fVar15);
        rlVertex2f(0.0,fVar9);
        rlTexCoord2f(fVar8,fVar15);
        rlVertex2f(nPatchInfo.source.width,fVar9);
        rlTexCoord2f(fVar8,y_00);
        rlVertex2f(nPatchInfo.source.width,local_e8);
        rlTexCoord2f(x,y_00);
        rlVertex2f(0.0,local_e8);
      }
      rlTexCoord2f(x,fVar14);
      rlVertex2f(0.0,fStack_d4);
      rlTexCoord2f(fVar8,fVar14);
      rlVertex2f(nPatchInfo.source.width,fStack_d4);
      rlTexCoord2f(fVar8,fVar15);
      rlVertex2f(nPatchInfo.source.width,fVar9);
      rlTexCoord2f(x,fVar15);
      fVar12 = 0.0;
    }
    else {
      if (nPatchInfo.layout != 0) goto LAB_00184b15;
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,local_e8);
      rlTexCoord2f(x_02,y_00);
      rlVertex2f(x_03,local_e8);
      rlTexCoord2f(x_02,y);
      rlVertex2f(x_03,0.0);
      rlTexCoord2f(x,y);
      rlVertex2f(0.0,0.0);
      if ((uVar3 & 1) != 0) {
        rlTexCoord2f(x_02,y_00);
        rlVertex2f(x_01,local_e8);
        rlTexCoord2f(x_00,y_00);
        rlVertex2f(fVar12,local_e8);
        rlTexCoord2f(x_00,y);
        rlVertex2f(fVar12,0.0);
        rlTexCoord2f(x_02,y);
        rlVertex2f(x_01,0.0);
      }
      rlTexCoord2f(x_00,y_00);
      rlVertex2f(fVar12,local_e8);
      rlTexCoord2f(fVar8,y_00);
      rlVertex2f(local_d8,local_e8);
      rlTexCoord2f(fVar8,y);
      rlVertex2f(local_d8,0.0);
      rlTexCoord2f(x_00,y);
      rlVertex2f(fVar12,0.0);
      if ((byte)((byte)uVar3 >> 1) != 0) {
        rlTexCoord2f(x,fVar15);
        rlVertex2f(0.0,fVar9);
        rlTexCoord2f(x_02,fVar15);
        rlVertex2f(x_03,fVar9);
        rlTexCoord2f(x_02,y_00);
        rlVertex2f(x_03,y_01);
        rlTexCoord2f(x,y_00);
        rlVertex2f(0.0,y_01);
        if ((uVar3 & 1) != 0) {
          rlTexCoord2f(x_02,fVar15);
          rlVertex2f(x_01,fVar9);
          rlTexCoord2f(x_00,fVar15);
          rlVertex2f(fVar12,fVar9);
          rlTexCoord2f(x_00,y_00);
          rlVertex2f(fVar12,y_01);
          rlTexCoord2f(x_02,y_00);
          rlVertex2f(x_01,y_01);
        }
        rlTexCoord2f(x_00,fVar15);
        rlVertex2f(fVar12,fVar9);
        rlTexCoord2f(fVar8,fVar15);
        rlVertex2f(local_d8,fVar9);
        rlTexCoord2f(fVar8,y_00);
        rlVertex2f(local_d8,y_01);
        rlTexCoord2f(x_00,y_00);
        rlVertex2f(fVar12,y_01);
      }
      rlTexCoord2f(x,fVar14);
      rlVertex2f(0.0,fStack_d4);
      rlTexCoord2f(x_02,fVar14);
      rlVertex2f(x_03,fStack_d4);
      rlTexCoord2f(x_02,fVar15);
      rlVertex2f(x_03,fVar9);
      rlTexCoord2f(x,fVar15);
      rlVertex2f(0.0,fVar9);
      if ((uVar3 & 1) != 0) {
        rlTexCoord2f(x_02,fVar14);
        rlVertex2f(x_01,fStack_d4);
        rlTexCoord2f(x_00,fVar14);
        rlVertex2f(fVar12,fStack_d4);
        rlTexCoord2f(x_00,fVar15);
        rlVertex2f(fVar12,fVar9);
        rlTexCoord2f(x_02,fVar15);
        rlVertex2f(x_01,fVar9);
      }
      rlTexCoord2f(x_00,fVar14);
      rlVertex2f(fVar12,fStack_d4);
      rlTexCoord2f(fVar8,fVar14);
      rlVertex2f(local_d8,fStack_d4);
      rlTexCoord2f(fVar8,fVar15);
      rlVertex2f(local_d8,fVar9);
      rlTexCoord2f(x_00,fVar15);
    }
  }
  rlVertex2f(fVar12,fVar9);
LAB_00184b15:
  rlEnd();
  rlPopMatrix();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTextureNPatch(Texture2D texture, NPatchInfo nPatchInfo, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patchWidth = ((int)dest.width <= 0)? 0.0f : dest.width;
        float patchHeight = ((int)dest.height <= 0)? 0.0f : dest.height;

        if (nPatchInfo.source.width < 0) nPatchInfo.source.x -= nPatchInfo.source.width;
        if (nPatchInfo.source.height < 0) nPatchInfo.source.y -= nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL) patchHeight = nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL) patchWidth = nPatchInfo.source.width;

        bool drawCenter = true;
        bool drawMiddle = true;
        float leftBorder = (float)nPatchInfo.left;
        float topBorder = (float)nPatchInfo.top;
        float rightBorder = (float)nPatchInfo.right;
        float bottomBorder = (float)nPatchInfo.bottom;

        // Adjust the lateral (left and right) border widths in case patchWidth < texture.width
        if (patchWidth <= (leftBorder + rightBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_VERTICAL)
        {
            drawCenter = false;
            leftBorder = (leftBorder/(leftBorder + rightBorder))*patchWidth;
            rightBorder = patchWidth - leftBorder;
        }

        // Adjust the lateral (top and bottom) border heights in case patchHeight < texture.height
        if (patchHeight <= (topBorder + bottomBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_HORIZONTAL)
        {
            drawMiddle = false;
            topBorder = (topBorder/(topBorder + bottomBorder))*patchHeight;
            bottomBorder = patchHeight - topBorder;
        }

        Vector2 vertA, vertB, vertC, vertD;
        vertA.x = 0.0f;                             // outer left
        vertA.y = 0.0f;                             // outer top
        vertB.x = leftBorder;                       // inner left
        vertB.y = topBorder;                        // inner top
        vertC.x = patchWidth  - rightBorder;        // inner right
        vertC.y = patchHeight - bottomBorder;       // inner bottom
        vertD.x = patchWidth;                       // outer right
        vertD.y = patchHeight;                      // outer bottom

        Vector2 coordA, coordB, coordC, coordD;
        coordA.x = nPatchInfo.source.x/width;
        coordA.y = nPatchInfo.source.y/height;
        coordB.x = (nPatchInfo.source.x + leftBorder)/width;
        coordB.y = (nPatchInfo.source.y + topBorder)/height;
        coordC.x = (nPatchInfo.source.x + nPatchInfo.source.width  - rightBorder)/width;
        coordC.y = (nPatchInfo.source.y + nPatchInfo.source.height - bottomBorder)/height;
        coordD.x = (nPatchInfo.source.x + nPatchInfo.source.width)/width;
        coordD.y = (nPatchInfo.source.y + nPatchInfo.source.height)/height;

        rlSetTexture(texture.id);

        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);               // Normal vector pointing towards viewer

                if (nPatchInfo.layout == NPATCH_NINE_PATCH)
                {
                    // ------------------------------------------------------------
                    // TOP-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // TOP-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // TOP-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawMiddle)
                    {
                        // ------------------------------------------------------------
                        // MIDDLE-LEFT QUAD
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                        if (drawCenter)
                        {
                            // MIDDLE-CENTER QUAD
                            rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-left corner for texture and quad
                            rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-right corner for texture and quad
                            rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-right corner for texture and quad
                            rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-left corner for texture and quad
                        }

                        // MIDDLE-RIGHT QUAD
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-left corner for texture and quad
                    }

                    // ------------------------------------------------------------
                    // BOTTOM-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // BOTTOM-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-left corner for texture and quad
                    }

                    // BOTTOM-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL)
                {
                    // TOP QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // MIDDLE QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                    }
                    // BOTTOM QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL)
                {
                    // LEFT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // CENTER QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // RIGHT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                }
            rlEnd();
        rlPopMatrix();

        rlSetTexture(0);
    }
}